

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
edition_unittest::TestNestedRequiredForeign::_InternalSerialize
          (TestNestedRequiredForeign *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestNestedRequiredForeign *value;
  TestRequiredForeign *value_00;
  TestRequiredEnum *value_01;
  TestRequiredEnumNoMask *value_02;
  TestRequiredEnumMulti *value_03;
  TestRequiredNoMaskMulti *value_04;
  ulong uVar1;
  anon_union_64_1_493b367e_for_TestNestedRequiredForeign_3 aVar2;
  uint8_t *puVar3;
  
  aVar2 = this->field_0;
  if (((undefined1  [64])aVar2 & (undefined1  [64])0x1) != (undefined1  [64])0x0) {
    value = (this->field_0)._impl_.child_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (1,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream);
  }
  if (((undefined1  [64])aVar2 & (undefined1  [64])0x2) != (undefined1  [64])0x0) {
    value_00 = (this->field_0)._impl_.payload_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (2,(MessageLite *)value_00,*(int *)((long)&value_00->field_0 + 4),target,
                        stream);
  }
  if (((undefined1  [64])aVar2 & (undefined1  [64])0x40) != (undefined1  [64])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                       (stream,(this->field_0)._impl_.dummy_,target);
  }
  if (((undefined1  [64])aVar2 & (undefined1  [64])0x4) != (undefined1  [64])0x0) {
    value_01 = (this->field_0)._impl_.required_enum_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (5,(MessageLite *)value_01,*(int *)((long)&value_01->field_0 + 4),target,
                        stream);
  }
  if (((undefined1  [64])aVar2 & (undefined1  [64])0x8) != (undefined1  [64])0x0) {
    value_02 = (this->field_0)._impl_.required_enum_no_mask_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (6,(MessageLite *)value_02,*(int *)((long)&value_02->field_0 + 4),target,
                        stream);
  }
  if (((undefined1  [64])aVar2 & (undefined1  [64])0x10) != (undefined1  [64])0x0) {
    value_03 = (this->field_0)._impl_.required_enum_multi_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (7,(MessageLite *)value_03,*(int *)((long)&value_03->field_0 + 4),target,
                        stream);
  }
  if (((undefined1  [64])aVar2 & (undefined1  [64])0x20) != (undefined1  [64])0x0) {
    value_04 = (this->field_0)._impl_.required_no_mask_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (9,(MessageLite *)value_04,*(int *)((long)&value_04->field_0 + 4),target,
                        stream);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestNestedRequiredForeign::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestNestedRequiredForeign& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestNestedRequiredForeign)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .edition_unittest.TestNestedRequiredForeign child = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.child_, this_._impl_.child_->GetCachedSize(), target,
        stream);
  }

  // .edition_unittest.TestRequiredForeign payload = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        2, *this_._impl_.payload_, this_._impl_.payload_->GetCachedSize(), target,
        stream);
  }

  // int32 dummy = 3;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_dummy(), target);
  }

  // .edition_unittest.TestRequiredEnum required_enum = 5;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        5, *this_._impl_.required_enum_, this_._impl_.required_enum_->GetCachedSize(), target,
        stream);
  }

  // .edition_unittest.TestRequiredEnumNoMask required_enum_no_mask = 6;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        6, *this_._impl_.required_enum_no_mask_, this_._impl_.required_enum_no_mask_->GetCachedSize(), target,
        stream);
  }

  // .edition_unittest.TestRequiredEnumMulti required_enum_multi = 7;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        7, *this_._impl_.required_enum_multi_, this_._impl_.required_enum_multi_->GetCachedSize(), target,
        stream);
  }

  // .edition_unittest.TestRequiredNoMaskMulti required_no_mask = 9;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        9, *this_._impl_.required_no_mask_, this_._impl_.required_no_mask_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestNestedRequiredForeign)
  return target;
}